

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemException.cpp
# Opt level: O3

char * __thiscall phpconvert::SystemException::what(SystemException *this)

{
  ExType EVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  string str;
  stringstream msg;
  char *local_1b8;
  char local_1a8 [16];
  stringstream local_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(local_198);
  EVar1 = this->code;
  if (EVar1 == INVALID_PARAMETERS) {
    std::__ostream_insert<char,std::char_traits<char>>(local_188,"Invalid parameters\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_188,"Usage: phpconvert(.exe) <option(s)>\n",0x24);
    std::__ostream_insert<char,std::char_traits<char>>(local_188,"Options:\n",9);
    lVar4 = 0x22;
    std::__ostream_insert<char,std::char_traits<char>>
              (local_188,"\t-d,\tSpecify the source directory\n",0x22);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_188,"\t-o,\tSpecify the output directory\n",0x22);
    pcVar3 = "\t-r,\tProcess directories recursive";
  }
  else if (EVar1 == CANT_OPEN_DIRECTORY) {
    lVar4 = 0x2e;
    pcVar3 = "Cant\'t open directory or directory not found.\n";
  }
  else if (EVar1 == FATAL) {
    lVar4 = 0x19;
    pcVar3 = "Application has crashed !";
  }
  else {
    lVar4 = 0xd;
    pcVar3 = "Unknonw error";
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_188,pcVar3,lVar4);
  std::__cxx11::stringbuf::str();
  sVar2 = strlen(local_1b8);
  pcVar3 = (char *)operator_new__(sVar2 + 1);
  strcpy(pcVar3,local_1b8);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  return pcVar3;
}

Assistant:

const char *SystemException::what() const throw() {
        stringstream msg;

        switch (code) {
            case INVALID_PARAMETERS:
                msg << "Invalid parameters\n";
                msg << "Usage: phpconvert(.exe) <option(s)>\n";
                msg << "Options:\n";
                msg << "\t-d,\tSpecify the source directory\n";
                msg << "\t-o,\tSpecify the output directory\n";
                msg << "\t-r,\tProcess directories recursive";
                break;
            case CANT_OPEN_DIRECTORY:
                msg << "Cant't open directory or directory not found.\n";
                break;
            case FATAL:
                msg << "Application has crashed !";
                break;
            default:
                msg << "Unknonw error";
                break;
        }
        string str = msg.str();
         const char *out = new char[strlen(str.c_str())+1];
//        out = str.c_str(); //@todo seems to be pointer as well, make it field
        std::strcpy(const_cast<char *>(out), str.c_str());
        return out;
    }